

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<std::complex<float>_>::Subst_LForward
          (TPZSkylMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  char cVar1;
  complex<float> **ppcVar2;
  complex<float> *pcVar3;
  int iVar4;
  undefined4 extraout_var;
  int extraout_var_00;
  long lVar5;
  complex<float> *__y;
  complex<float> *pcVar6;
  int iVar7;
  int64_t j;
  long col;
  long row;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float local_68;
  float fStack_64;
  complex<float> local_38;
  
  lVar5 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  iVar4 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  iVar7 = 0;
  if ((lVar5 == CONCAT44(extraout_var,iVar4)) &&
     ((cVar1 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed,
      cVar1 == '\x04' || (cVar1 == '\x01')))) {
    iVar4 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])(this);
    row = 0;
    lVar5 = CONCAT44(extraout_var_00,iVar4);
    if (CONCAT44(extraout_var_00,iVar4) == 0 || extraout_var_00 < 0) {
      lVar5 = row;
    }
    for (; row != lVar5; row = row + 1) {
      for (col = 0; col < (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
          col = col + 1) {
        ppcVar2 = (this->fElem).fStore;
        pcVar6 = ppcVar2[row];
        pcVar3 = ppcVar2[row + 1];
        __y = TPZFMatrix<std::complex<float>_>::operator()(B,row,col);
        local_68 = 0.0;
        fStack_64 = 0.0;
        while( true ) {
          __y = __y + -1;
          pcVar6 = pcVar6 + 1;
          if (pcVar3 <= pcVar6) break;
          local_38._M_value = pcVar6->_M_value ^ 0x8000000000000000;
          std::operator*(&local_38,__y);
          local_68 = local_68 + extraout_XMM0_Da;
          fStack_64 = fStack_64 + extraout_XMM0_Db;
        }
        pcVar6 = TPZFMatrix<std::complex<float>_>::operator()(B,row,col);
        pcVar6->_M_value =
             CONCAT44((float)(pcVar6->_M_value >> 0x20) - fStack_64,
                      (float)pcVar6->_M_value - local_68);
      }
    }
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_LForward( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != this->Dim()) || (this->fDecomposed != ELDLt && this->fDecomposed != ELU) )
        return( 0 );
    
    int64_t dimension =this->Dim();
    for ( int64_t k = 0; k < dimension; k++ ) {
        for ( int64_t j = 0; j < B->Cols(); j++ ) {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
        }
    }
    return( 1 );
}